

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZReadGIDGrid.cpp
# Opt level: O0

void __thiscall TPZReadGIDGrid::TPZReadGIDGrid(TPZReadGIDGrid *this)

{
  undefined4 *in_RDI;
  TPZStack<MaterialDataV,_10> *in_stack_ffffffffffffffe0;
  TPZStack<MaterialDataV,_10> *this_00;
  
  TPZStack<MaterialDataV,_10>::TPZStack(in_stack_ffffffffffffffe0);
  this_00 = (TPZStack<MaterialDataV,_10> *)(in_RDI + 0x18a);
  TPZStack<MaterialDataV,_10>::TPZStack(this_00);
  TPZStack<MaterialDataV,_10>::TPZStack(this_00);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined8 *)(in_RDI + 4) = 0x3ff0000000000000;
  return;
}

Assistant:

TPZReadGIDGrid::TPZReadGIDGrid() {
	MatNumber = 0;
	BCNumber = 0;
	fProblemDimension = 0;
	fDimensionlessL = 1.0;
}